

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O2

ssize_t anon_unknown.dwarf_3376::ReadPersistent(int fd,void *buf,size_t count)

{
  ssize_t sVar1;
  int *piVar2;
  ulong uVar3;
  
  if (fd < 0) {
    fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
            ,0x45,"fd",">=","0");
    abort();
  }
  uVar3 = 0;
  do {
    if (count < uVar3 || count - uVar3 == 0) break;
    while (sVar1 = read(fd,(void *)((long)buf + uVar3),count - uVar3), sVar1 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        return -1;
      }
    }
    uVar3 = uVar3 + sVar1;
  } while (sVar1 != 0);
  if (uVar3 <= count) {
    return uVar3;
  }
  syscall(1,2,"Check failed: num_bytes <= count\n",0x21);
  abort();
}

Assistant:

static ssize_t ReadPersistent(const int fd, void *buf, const size_t count) {
  CHECK_GE(fd, 0);
  char *buf0 = reinterpret_cast<char *>(buf);
  ssize_t num_bytes = 0;
  while (num_bytes < count) {
    ssize_t len;
    NO_INTR(len = read(fd, buf0 + num_bytes, count - num_bytes));
    if (len < 0) {  // There was an error other than EINTR.
      return -1;
    }
    if (len == 0) {  // Reached EOF.
      break;
    }
    num_bytes += len;
  }
  CHECK(num_bytes <= count);
  return num_bytes;
}